

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O1

void __thiscall
Eigen::internal::gemm_pack_rhs<double,_long,_4,_0,_false,_true>::operator()
          (gemm_pack_rhs<double,_long,_4,_0,_false,_true> *this,double *blockB,double *rhs,
          long rhsStride,long depth,long cols,long stride,long offset)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  long j2;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  
  if ((depth <= stride) && (offset <= stride)) {
    uVar7 = cols + 3;
    if (-1 < cols) {
      uVar7 = cols;
    }
    uVar8 = uVar7 & 0xfffffffffffffffc;
    if (cols < 4) {
      lVar10 = 0;
    }
    else {
      pdVar11 = rhs + rhsStride * 3;
      pdVar6 = rhs + rhsStride * 2;
      pdVar3 = rhs + rhsStride;
      lVar10 = 0;
      lVar4 = 0;
      pdVar2 = rhs;
      do {
        lVar9 = lVar10 + offset * 4;
        if (0 < depth) {
          lVar1 = 0;
          lVar5 = depth;
          do {
            blockB[offset * 4 + lVar10 + lVar1] = *(double *)((long)pdVar2 + lVar1 * 2);
            blockB[offset * 4 + lVar10 + lVar1 + 1] = *(double *)((long)pdVar3 + lVar1 * 2);
            blockB[offset * 4 + lVar10 + lVar1 + 2] = *(double *)((long)pdVar6 + lVar1 * 2);
            blockB[offset * 4 + lVar10 + lVar1 + 3] = *(double *)((long)pdVar11 + lVar1 * 2);
            lVar1 = lVar1 + 4;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
          lVar9 = lVar9 + lVar1;
        }
        lVar10 = lVar9 + ((stride - depth) - offset) * 4;
        lVar4 = lVar4 + 4;
        pdVar11 = pdVar11 + rhsStride * 4;
        pdVar6 = pdVar6 + rhsStride * 4;
        pdVar3 = pdVar3 + rhsStride * 4;
        pdVar2 = pdVar2 + rhsStride * 4;
      } while (lVar4 < (long)uVar8);
    }
    if ((long)uVar8 < cols) {
      pdVar11 = rhs + ((long)uVar7 >> 2) * rhsStride * 4;
      do {
        lVar10 = lVar10 + offset;
        if (0 < depth) {
          lVar4 = 0;
          do {
            blockB[lVar10 + lVar4] = pdVar11[lVar4];
            lVar4 = lVar4 + 1;
          } while (depth != lVar4);
          lVar10 = lVar10 + lVar4;
        }
        lVar10 = lVar10 + ((stride - depth) - offset);
        uVar8 = uVar8 + 1;
        pdVar11 = pdVar11 + rhsStride;
      } while (uVar8 != cols);
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x4c6,
                "void Eigen::internal::gemm_pack_rhs<double, long, 4, 0, false, true>::operator()(Scalar *, const Scalar *, Index, Index, Index, Index, Index) [Scalar = double, Index = long, nr = 4, StorageOrder = 0, Conjugate = false, PanelMode = true]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, nr, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const Scalar* rhs, Index rhsStride, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS COLMAJOR");
  EIGEN_UNUSED_VARIABLE(stride)
  EIGEN_UNUSED_VARIABLE(offset)
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols = (cols/nr) * nr;
  Index count = 0;
  for(Index j2=0; j2<packet_cols; j2+=nr)
  {
    // skip what we have before
    if(PanelMode) count += nr * offset;
    const Scalar* b0 = &rhs[(j2+0)*rhsStride];
    const Scalar* b1 = &rhs[(j2+1)*rhsStride];
    const Scalar* b2 = &rhs[(j2+2)*rhsStride];
    const Scalar* b3 = &rhs[(j2+3)*rhsStride];
    for(Index k=0; k<depth; k++)
    {
                blockB[count+0] = cj(b0[k]);
                blockB[count+1] = cj(b1[k]);
      if(nr==4) blockB[count+2] = cj(b2[k]);
      if(nr==4) blockB[count+3] = cj(b3[k]);
      count += nr;
    }
    // skip what we have after
    if(PanelMode) count += nr * (stride-offset-depth);
  }

  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const Scalar* b0 = &rhs[(j2+0)*rhsStride];
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(b0[k]);
      count += 1;
    }
    if(PanelMode) count += (stride-offset-depth);
  }
}